

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

int count_newlines(char *str)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = strchr(str,10);
  iVar2 = 0;
  for (; pcVar1 != (char *)0x0; pcVar1 = strchr(pcVar1 + 1,10)) {
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int count_newlines(const char *str) {
  int count = 0;
  const char *ptr = str;
  while ((ptr = strchr(ptr, '\n')) != NULL) {
    count++;
    ptr++;
  }
  return count;
}